

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32_t google::protobuf::internal::ReflectionSchema::OffsetValue(uint32_t v,Type type)

{
  Type type_local;
  uint32_t v_local;
  
  if (((type == TYPE_MESSAGE) || (type == TYPE_STRING)) || (type == TYPE_BYTES)) {
    type_local = v & 0x7ffffffe;
  }
  else {
    type_local = v & 0x7fffffff;
  }
  return type_local;
}

Assistant:

static uint32_t OffsetValue(uint32_t v, FieldDescriptor::Type type) {
    if (type == FieldDescriptor::TYPE_MESSAGE ||
        type == FieldDescriptor::TYPE_STRING ||
        type == FieldDescriptor::TYPE_BYTES) {
      return v & ~kSplitFieldOffsetMask & ~kInlinedMask & ~kLazyMask;
    }
    return v & (~kSplitFieldOffsetMask);
  }